

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O1

unique_ptr<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>_>
__thiscall
spvtools::MakeUnique<spvtools::opt::ValueNumberTable,spvtools::opt::IRContext*>
          (spvtools *this,IRContext **args)

{
  IRContext *pIVar1;
  ValueNumberTable *this_00;
  
  this_00 = (ValueNumberTable *)operator_new(0x80);
  pIVar1 = *args;
  (this_00->instruction_to_value_)._M_h._M_buckets =
       &(this_00->instruction_to_value_)._M_h._M_single_bucket;
  (this_00->instruction_to_value_)._M_h._M_bucket_count = 1;
  (this_00->instruction_to_value_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->instruction_to_value_)._M_h._M_element_count = 0;
  (this_00->instruction_to_value_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->instruction_to_value_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->instruction_to_value_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->id_to_value_)._M_h._M_buckets = &(this_00->id_to_value_)._M_h._M_single_bucket;
  (this_00->id_to_value_)._M_h._M_bucket_count = 1;
  (this_00->id_to_value_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this_00->id_to_value_)._M_h._M_element_count = 0;
  (this_00->id_to_value_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this_00->id_to_value_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this_00->id_to_value_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00->context_ = pIVar1;
  this_00->next_value_number_ = 1;
  opt::ValueNumberTable::BuildDominatorTreeValueNumberTable(this_00);
  *(ValueNumberTable **)this = this_00;
  return (__uniq_ptr_data<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::ValueNumberTable,_std::default_delete<spvtools::opt::ValueNumberTable>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}